

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O2

void __thiscall QDaemonThread::QDaemonThread(QDaemonThread *this,QObject *parent)

{
  QSlotObjectBase *slotObjRaw;
  long in_FS_OFFSET;
  QObject local_30;
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QThread::QThread(&this->super_QThread,parent);
  (this->super_QThread).super_QObject._vptr_QObject = (_func_int **)&PTR_metaObject_00666f48;
  local_30.d_ptr.d = (QObjectData *)QThread::started;
  local_20 = 0;
  slotObjRaw = (QSlotObjectBase *)operator_new(0x10);
  (slotObjRaw->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  slotObjRaw->m_impl =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/thread/qthread.cpp:1396:13),_QtPrivate::List<>,_void>
       ::impl;
  QObject::connectImpl
            (&local_30,(QObject *)this,&local_30.d_ptr.d,(QObject *)this,(void **)0x0,slotObjRaw,
             DirectConnection,(int *)0x0,&QThread::staticMetaObject);
  QMetaObject::Connection::~Connection((Connection *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDaemonThread::QDaemonThread(QObject *parent)
    : QThread(parent)
{
    // QThread::started() is emitted from the thread we start
    connect(this, &QThread::started,
            this,
            [](){ QThreadData::current()->requiresCoreApplication = false; },
            Qt::DirectConnection);
}